

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

CompositeISE *
Saturation::SaturationAlgorithm::createISE
          (Problem *prb,Options *opt,Ordering *ordering,bool alascaTakesOver)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Condensation CVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  CompositeISE *this;
  ImmediateSimplificationEngine *pIVar8;
  ulong uVar9;
  SimplifyingGeneratingInference1 *pSVar10;
  InterpretedEvaluation *this_00;
  PolynomialEvaluationRule *this_01;
  UndesiredAnswerLiteralRemoval *this_02;
  undefined *puVar11;
  void **head;
  undefined8 *puVar12;
  string local_50;
  
  this = (CompositeISE *)::operator_new(0x20);
  (this->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  (this->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_00b39898;
  this->_inners = (ISList *)0x0;
  this->_innersMany = (ISList *)0x0;
  bVar5 = Kernel::Problem::hasEquality(prb);
  if ((bVar5) ||
     ((bVar5 = Kernel::Problem::hasFOOL(prb), bVar5 &&
      ((opt->_FOOLParamodulation).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 ==
       '\x01')))) {
    bVar5 = true;
    if ((opt->_equationalTautologyRemoval).super_OptionValue<bool>.super_AbstractOptionValue.
        field_0x92 == '\x01') {
      pIVar8 = (ImmediateSimplificationEngine *)::operator_new(400);
      (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__EquationalTautologyRemoval_00b38240;
      DP::SimpleCongruenceClosure::SimpleCongruenceClosure
                ((SimpleCongruenceClosure *)(pIVar8 + 1),(Ordering *)0x0);
      Inferences::CompositeISE::addFront(this,pIVar8);
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  CVar2 = (opt->_condensation).super_OptionValue<Shell::Options::Condensation>.actualValue;
  if (CVar2 == ON) {
    puVar11 = &Inferences::Condensation::vtable;
LAB_00675a69:
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)(puVar11 + 0x10);
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  else if (CVar2 == FAST) {
    puVar11 = &Inferences::FastCondensation::vtable;
    goto LAB_00675a69;
  }
  if (*(char *)(Lib::env + 0xee42) == '\x01') {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b37d48;
    Inferences::CompositeISE::addFront(this,pIVar8);
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b37e00;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  if (*(char *)(Lib::env + 0xf1a2) == '\x01') {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b39a98;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  bVar6 = Kernel::Problem::hasLogicalProxy(prb);
  if ((((bVar6) || (bVar6 = Kernel::Problem::hasBoolVar(prb), bVar6)) ||
      (bVar6 = Kernel::Problem::hasFOOL(prb), bVar6)) &&
     ((bVar6 = Kernel::Problem::isHigherOrder(prb), bVar6 && (*(char *)(Lib::env + 0xed6a) == '\0'))
     )) {
    iVar7 = *(int *)(Lib::env + 0xf538);
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    if (iVar7 == 0) {
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b375f8;
      Inferences::CompositeISE::addFrontMany(this,pIVar8);
    }
    else {
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b37598;
      Inferences::CompositeISE::addFront(this,pIVar8);
    }
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b37480;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  bVar6 = Kernel::Problem::hasFOOL(prb);
  if (((bVar6) &&
      ((opt->_casesSimp).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01')) &&
     ((opt->_cases).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\0')) {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b37938;
    Inferences::CompositeISE::addFrontMany(this,pIVar8);
  }
  if (bVar5) {
    if (*(char *)(DAT_00b521b0 + 0x1c8) == '\x01') {
      pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b37ec0;
      Inferences::CompositeISE::addFront(this,pIVar8);
    }
    if ((*(int *)(DAT_00b521b0 + 0x26c) != 0) &&
       ((opt->_termAlgebraInferences).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92
        == '\x01')) {
      pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b3a988;
      Inferences::CompositeISE::addFront(this,pIVar8);
      pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b3aa48;
      Inferences::CompositeISE::addFront(this,pIVar8);
      pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b3aaa8;
      Inferences::CompositeISE::addFront(this,pIVar8);
    }
  }
  bVar6 = Kernel::Problem::hasInterpretedOperations(prb);
  if ((!bVar6) && (bVar6 = Kernel::Problem::hasNumerals(prb), !bVar6)) goto LAB_00675f9c;
  if (*(int *)(Lib::env + 0xeb98) == 0) {
    Inferences::allArithmeticSubtermGeneralizations();
    uVar4 = local_50.field_2._M_allocated_capacity;
    for (puVar12 = (undefined8 *)local_50._M_string_length; puVar12 != (undefined8 *)uVar4;
        puVar12 = puVar12 + 1) {
      pIVar8 = Inferences::SimplifyingGeneratingInference1::asISE
                         ((SimplifyingGeneratingInference1 *)*puVar12);
      Inferences::CompositeISE::addFront(this,pIVar8);
    }
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      uVar9 = (long)local_50._M_dataplus._M_p * 8 + 0xfU & 0xfffffffffffffff0;
      if (uVar9 == 0) {
        *(undefined8 *)local_50._M_string_length = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x11) {
        *(undefined8 *)local_50._M_string_length = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x19) {
        *(undefined8 *)local_50._M_string_length = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x21) {
        *(undefined8 *)local_50._M_string_length = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x31) {
        *(undefined8 *)local_50._M_string_length = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x41) {
        *(undefined8 *)local_50._M_string_length = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._M_string_length;
      }
      else {
        operator_delete((void *)local_50._M_string_length,0x10);
      }
    }
  }
  if (*(int *)(Lib::env + 0xe488) == 0) {
    pSVar10 = (SimplifyingGeneratingInference1 *)::operator_new(0x20);
    (pSVar10->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)0x0;
    (pSVar10->super_SimplifyingGeneratingInference).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar10->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)0x0;
    (pSVar10->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar10->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)&PTR__SimplifyingGeneratingInference1_00b38e00;
    (pSVar10->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)&PTR__GaussianVariableElimination_00b38e50;
    pIVar8 = Inferences::SimplifyingGeneratingInference1::asISE(pSVar10);
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  if (*(int *)(Lib::env + 0xea98) == 0) {
    pSVar10 = (SimplifyingGeneratingInference1 *)::operator_new(0x30);
    Inferences::Cancellation::Cancellation((Cancellation *)pSVar10,ordering);
    pIVar8 = Inferences::SimplifyingGeneratingInference1::asISE(pSVar10);
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  lVar3 = Lib::env;
  if (!alascaTakesOver) {
    if (*(int *)(Lib::env + 0xc7f8) == 2) {
      this_01 = (PolynomialEvaluationRule *)::operator_new(0x58);
      Inferences::PolynomialEvaluationRule::PolynomialEvaluationRule(this_01,ordering);
      this_00 = (InterpretedEvaluation *)
                Inferences::SimplifyingGeneratingInference1::asISE
                          ((SimplifyingGeneratingInference1 *)this_01);
    }
    else {
      if (*(int *)(Lib::env + 0xc7f8) != 1) goto LAB_00675f66;
      this_00 = (InterpretedEvaluation *)::operator_new(0x18);
      Inferences::InterpretedEvaluation::InterpretedEvaluation
                (this_00,*(bool *)(lVar3 + 0xe2d2),ordering);
    }
    Inferences::CompositeISE::addFront(this,&this_00->super_ImmediateSimplificationEngine);
  }
LAB_00675f66:
  if (*(char *)(Lib::env + 0xe3aa) == '\x01') {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__PushUnaryMinus_00b3a6b0;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
LAB_00675f9c:
  if (bVar5) {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b39bb8;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x18);
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b3a928;
  *(undefined1 *)&pIVar8[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(this,pIVar8);
  if (*(char *)(Lib::env + 0xfd42) == '\x01') {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b39b58;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b39af8;
  Inferences::CompositeISE::addFront(this,pIVar8);
  if (*(int *)(Lib::env + 0x8898) == 2) {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b3a178;
    Inferences::CompositeISE::addFront(this,pIVar8);
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b3a1d8;
    Inferences::CompositeISE::addFront(this,pIVar8);
  }
  else if (*(int *)(Lib::env + 0x8898) == 1) {
    pIVar8 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar8->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar8->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b41a80;
    Inferences::CompositeISE::addFront(this,pIVar8);
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(Lib::env + 0x8a90),
               *(long *)(Lib::env + 0x8a98) + *(long *)(Lib::env + 0x8a90));
    iVar7 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar7 != 0) {
      this_02 = (UndesiredAnswerLiteralRemoval *)::operator_new(0x18);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(Lib::env + 0x8a90),
                 *(long *)(Lib::env + 0x8a98) + *(long *)(Lib::env + 0x8a90));
      Inferences::UndesiredAnswerLiteralRemoval::UndesiredAnswerLiteralRemoval(this_02,&local_50);
      Inferences::CompositeISE::addFront(this,(ImmediateSimplificationEngine *)this_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return this;
}

Assistant:

CompositeISE* SaturationAlgorithm::createISE(Problem& prb, const Options& opt, Ordering& ordering, bool alascaTakesOver)
{
  CompositeISE* res =new CompositeISE();

  bool mayHaveEquality = couldEqualityArise(prb,opt);

  if (mayHaveEquality && opt.equationalTautologyRemoval()) {
    res->addFront(new EquationalTautologyRemoval());
  }

  switch (opt.condensation()) {
    case Options::Condensation::ON:
      res->addFront(new Condensation());
      break;
    case Options::Condensation::FAST:
      res->addFront(new FastCondensation());
      break;
    case Options::Condensation::OFF:
      break;
  }

  if (env.options->combinatorySup()) {
    res->addFront(new CombinatorDemodISE());
    res->addFront(new CombinatorNormalisationISE());
  }

  if (env.options->choiceReasoning()) {
    res->addFront(new ChoiceDefinitionISE());
  }

  if((prb.hasLogicalProxy() || prb.hasBoolVar() || prb.hasFOOL()) &&
      prb.isHigherOrder() && !env.options->addProxyAxioms()){
    if(env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER){
      /*res->addFrontMany(new ProxyISE());
      res->addFront(new OrImpAndProxyISE());
      res->addFront(new NotProxyISE());
      res->addFront(new EqualsProxyISE());
      res->addFront(new PiSigmaProxyISE());*/
      res->addFrontMany(new EagerClausificationISE());
    }
    else {
      res->addFront(new IFFXORRewriterISE());
    }
    res->addFront(new BoolSimp());
  }

  if (prb.hasFOOL() && opt.casesSimp() && !opt.cases()) {
    res->addFrontMany(new CasesSimp());
  }

  // Only add if there are distinct groups
  if (mayHaveEquality && env.signature->hasDistinctGroups()) {
    res->addFront(new DistinctEqualitySimplifier());
  }
  if (mayHaveEquality && env.signature->hasTermAlgebras()) {
    if (opt.termAlgebraInferences()) {
      res->addFront(new DistinctnessISE());
      res->addFront(new InjectivityISE());
      res->addFront(new NegativeInjectivityISE());
    }
  }
  if (prb.hasInterpretedOperations() || prb.hasNumerals()) {
    if (env.options->arithmeticSubtermGeneralizations() == Options::ArithmeticSimplificationMode::FORCE) {
      for (auto gen : allArithmeticSubtermGeneralizations()) {
        res->addFront(&gen->asISE());
      }
    }

    if (env.options->gaussianVariableElimination() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new GaussianVariableElimination())->asISE());
    }

    if (env.options->cancellation() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new Cancellation(ordering))->asISE());
    }

    if (alascaTakesOver) {
      // all alasca rules are added later
    } else switch (env.options->evaluationMode()) {
      case Options::EvaluationMode::OFF:
        break;
      case Options::EvaluationMode::SIMPLE:
        res->addFront(new InterpretedEvaluation(env.options->inequalityNormalization(), ordering));
        break;
      case Options::EvaluationMode::POLYNOMIAL_FORCE:
        res->addFront(&(new PolynomialEvaluationRule(ordering))->asISE());
        break;
      case Options::EvaluationMode::POLYNOMIAL_CAUTIOUS:
        break;
    }

    if (env.options->pushUnaryMinus()) {
      res->addFront(new PushUnaryMinus());
    }
  }
  if (mayHaveEquality) {
    res->addFront(new TrivialInequalitiesRemovalISE());
  }
  res->addFront(new TautologyDeletionISE());
  if (env.options->newTautologyDel()) {
    res->addFront(new TautologyDeletionISE2());
  }
  res->addFront(new DuplicateLiteralRemovalISE());

  if (env.options->questionAnswering() == Options::QuestionAnsweringMode::PLAIN) {
    res->addFront(new AnswerLiteralResolver());
    if (env.options->questionAnsweringAvoidThese() != "") {
      res->addFront(new UndesiredAnswerLiteralRemoval(env.options->questionAnsweringAvoidThese()));
    }
  } else if (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS) {
    res->addFront(new UncomputableAnswerLiteralRemoval());
    res->addFront(new MultipleAnswerLiteralRemoval());
  }
  return res;
}